

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O0

int xmlXPathContextSetCache(xmlXPathContextPtr ctxt,int active,int value,int options)

{
  void *pvVar1;
  xmlXPathContextCachePtr pxVar2;
  xmlXPathContextCachePtr cache;
  int local_20;
  int options_local;
  int value_local;
  int active_local;
  xmlXPathContextPtr ctxt_local;
  
  if (ctxt == (xmlXPathContextPtr)0x0) {
    ctxt_local._4_4_ = -1;
  }
  else {
    if (active == 0) {
      if (ctxt->cache != (void *)0x0) {
        xmlXPathFreeCache((xmlXPathContextCachePtr)ctxt->cache);
        ctxt->cache = (void *)0x0;
      }
    }
    else {
      if (ctxt->cache == (void *)0x0) {
        pxVar2 = xmlXPathNewCache();
        ctxt->cache = pxVar2;
        if (ctxt->cache == (void *)0x0) {
          return -1;
        }
      }
      pvVar1 = ctxt->cache;
      if (options == 0) {
        local_20 = value;
        if (value < 0) {
          local_20 = 100;
        }
        *(int *)((long)pvVar1 + 0x28) = local_20;
        *(int *)((long)pvVar1 + 0x2c) = local_20;
        *(int *)((long)pvVar1 + 0x34) = local_20;
        *(int *)((long)pvVar1 + 0x30) = local_20;
        *(int *)((long)pvVar1 + 0x38) = local_20;
      }
    }
    ctxt_local._4_4_ = 0;
  }
  return ctxt_local._4_4_;
}

Assistant:

int
xmlXPathContextSetCache(xmlXPathContextPtr ctxt,
			int active,
			int value,
			int options)
{
    if (ctxt == NULL)
	return(-1);
    if (active) {
	xmlXPathContextCachePtr cache;

	if (ctxt->cache == NULL) {
	    ctxt->cache = xmlXPathNewCache();
	    if (ctxt->cache == NULL)
		return(-1);
	}
	cache = (xmlXPathContextCachePtr) ctxt->cache;
	if (options == 0) {
	    if (value < 0)
		value = 100;
	    cache->maxNodeset = value;
	    cache->maxString = value;
	    cache->maxNumber = value;
	    cache->maxBoolean = value;
	    cache->maxMisc = value;
	}
    } else if (ctxt->cache != NULL) {
	xmlXPathFreeCache((xmlXPathContextCachePtr) ctxt->cache);
	ctxt->cache = NULL;
    }
    return(0);
}